

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  size_type new_cap;
  pointer pdVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  size_t i_2;
  size_type __n;
  size_t i;
  long lVar8;
  long lVar9;
  uint uVar10;
  size_t row;
  size_type sVar11;
  size_t i_8;
  bool bVar12;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  B;
  Timer timer;
  vector<double,_std::allocator<double>_> exec_times;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_cols;
  vector<double,_std::allocator<double>_> B_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_cols;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  A_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_rows;
  vector<double,_std::allocator<double>_> A_csr_values;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  A_flatmap;
  
  if (argc < 3) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Missing argument: Matrix-dimension, Nonzeros/row");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar3 = 1;
  }
  else {
    iVar3 = atoi(argv[1]);
    __n = (size_type)iVar3;
    iVar3 = atoi(argv[2]);
    std::vector<double,_std::allocator<double>_>::vector(&exec_times,10,(allocator_type *)&A_map);
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::vector(&A_map,__n,(allocator_type *)&A_flatmap);
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::vector(&A_flatmap,__n,(allocator_type *)&A_csr_rows);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&A_csr_rows,__n + 1,(allocator_type *)&A_csr_cols);
    uVar10 = 0;
    for (sVar11 = 0; lVar8 = (long)iVar3, sVar11 != __n; sVar11 = sVar11 + 1) {
      while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
        iVar4 = rand();
        A_csr_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (undefined4)((ulong)(long)iVar4 % __n);
        iVar4 = rand();
        dVar1 = (double)iVar4 / 2147483647.0 + 1.0;
        pmVar6 = std::
                 map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                 ::operator[](A_map.
                              super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + sVar11,
                              (key_type *)&A_csr_cols);
        *pmVar6 = dVar1;
        pmVar6 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
                 priv_subscript(A_flatmap.
                                super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + sVar11,
                                (key_type *)&A_csr_cols);
        *pmVar6 = dVar1;
      }
      A_csr_rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar11] = uVar10;
      uVar10 = uVar10 + (int)A_map.
                             super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[sVar11]._M_t._M_impl.
                             super__Rb_tree_header._M_node_count;
    }
    A_csr_rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = uVar10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&A_csr_cols,(ulong)uVar10,(allocator_type *)&A_csr_values);
    std::vector<double,_std::allocator<double>_>::vector
              (&A_csr_values,(ulong)uVar10,(allocator_type *)&B);
    lVar8 = 0;
    for (sVar11 = 0;
        pdVar2 = A_csr_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start, sVar11 != __n; sVar11 = sVar11 + 1) {
      p_Var7 = A_map.
               super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar11]._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_left;
      lVar9 = CONCAT44(A_csr_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       A_csr_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_);
      while ((_Rb_tree_header *)p_Var7 !=
             &A_map.
              super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar11]._M_t._M_impl.super__Rb_tree_header)
      {
        *(_Rb_tree_color *)(lVar9 + lVar8 * 4) = p_Var7[1]._M_color;
        pdVar2[lVar8] = (double)p_Var7[1]._M_parent;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        lVar8 = lVar8 + 1;
      }
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar5,"    ");
    timer.ts = 0.0;
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&A_map,&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector(&B);
    }
    print_median(&exec_times);
    new_cap = (long)iVar3 * 2;
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *)&B,__n,(allocator_type *)&B_cols);
      lVar9 = 0;
      sVar11 = __n;
      while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
        boost::container::
        vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
        ::reserve((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                   *)(&((B.
                         super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar9
                     ),new_cap);
        lVar9 = lVar9 + 0x18;
      }
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&A_map,(vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                         *)&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)&B);
    }
    print_median(&exec_times);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
                (&A_map,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&B,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<double,_std::allocator<double>_> *)
                 &B_values.super__Vector_base<double,_std::allocator<double>_>);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&B_values.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&B);
    }
    print_median(&exec_times);
    std::operator<<((ostream *)&std::cout,"     ");
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&A_flatmap,&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector(&B);
    }
    print_median(&exec_times);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *)&B,__n,(allocator_type *)&B_cols);
      lVar9 = 0;
      sVar11 = __n;
      while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
        boost::container::
        vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
        ::reserve((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                   *)(&((B.
                         super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar9
                     ),new_cap);
        lVar9 = lVar9 + 0x18;
      }
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&A_flatmap,
                 (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                  *)&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)&B);
    }
    print_median(&exec_times);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
                (&A_flatmap,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&B,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<double,_std::allocator<double>_> *)
                 &B_values.super__Vector_base<double,_std::allocator<double>_>);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&B_values.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&B);
    }
    print_median(&exec_times);
    std::operator<<((ostream *)&std::cout,"     ");
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      run<unsigned_int,double,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                (&A_csr_rows,&A_csr_cols,&A_csr_values,&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector(&B);
    }
    print_median(&exec_times);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *)&B,__n,(allocator_type *)&B_cols);
      lVar9 = 0;
      sVar11 = __n;
      while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
        boost::container::
        vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
        ::reserve((vector<boost::container::dtl::pair<unsigned_int,_double>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_double>_>,_void>
                   *)(&((B.
                         super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar9
                     ),new_cap);
        lVar9 = lVar9 + 0x18;
      }
      run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                (&A_csr_rows,&A_csr_cols,&A_csr_values,
                 (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                  *)&B);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)&B);
    }
    print_median(&exec_times);
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      Timer::start(&timer);
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      B.
      super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      B_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      run<unsigned_int,double>
                (&A_csr_rows,&A_csr_cols,&A_csr_values,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&B,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<double,_std::allocator<double>_> *)
                 &B_values.super__Vector_base<double,_std::allocator<double>_>);
      dVar1 = Timer::get(&timer);
      exec_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar8] = dVar1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&B_values.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&B_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&B);
    }
    print_median(&exec_times);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&A_csr_values.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&A_csr_cols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&A_csr_rows.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::~vector(&A_flatmap);
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::~vector(&A_map);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&exec_times.super__Vector_base<double,_std::allocator<double>_>);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 3)
  {
    std::cout << "Missing argument: Matrix-dimension, Nonzeros/row" << std::endl;
    return EXIT_FAILURE;
  }

  std::size_t runs = 10;
  std::size_t N = atoi(argv[1]);
  std::size_t nnz_per_row = atoi(argv[2]);
  std::vector<double> exec_times(runs);

  //
  // Matrix initialization
  //
  std::vector< std::map<unsigned int, double> > A_map(N);
  std::vector< boost::container::flat_map<unsigned int, double> > A_flatmap(N);
  std::vector< unsigned int > A_csr_rows(N+1);

  unsigned int total_nnz = 0;
  for (std::size_t row=0; row<N; ++row)
  {
    for (std::size_t j=0; j<nnz_per_row; ++j)
    {
      unsigned int col_idx = rand() % N;
      double value = 1.0 + double(rand()) / double(RAND_MAX);
      A_map[row][col_idx] = value;
      A_flatmap[row][col_idx] = value;
    }
    A_csr_rows[row] = total_nnz;
    total_nnz += A_map[row].size();
  }
  A_csr_rows[N] = total_nnz;

  std::vector<unsigned int> A_csr_cols(total_nnz);
  std::vector<double> A_csr_values(total_nnz);

  std::size_t index = 0;
  for (std::size_t row=0; row<N; ++row)
    for (std::map<unsigned int, double>::const_iterator it = A_map[row].begin(); it != A_map[row].end(); ++it, ++index)
    {
      A_csr_cols[index] = it->first;
      A_csr_values[index] = it->second;
    }


  //
  // Run benchmarks
  //
  //std::cout << "# Size  map->map  map->flatmap  mat->csr     flatmap->map  flatmap->flatmap  flatmap->csr      csr->map  csr->flatmap  csr->csr" << std::endl;
  std::cout << N << "    ";

  Timer timer;

  // map to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_map, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // flatmap to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_flatmap, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // csr to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_csr_rows, A_csr_cols, A_csr_values, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << std::endl;

  return EXIT_SUCCESS;
}